

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RNEMDParameters.cpp
# Opt level: O2

bool __thiscall OpenMD::RNEMD::RNEMDParameters::requiresElectricField(RNEMDParameters *this)

{
  bool bVar1;
  string token;
  StringTokenizer tokenizer;
  allocator<char> local_c9;
  string local_c8;
  string local_a8;
  StringTokenizer local_88;
  
  if (requiresElectricField()::wasParsed == '\0') {
    std::__cxx11::string::string((string *)&local_c8,(string *)&(this->OutputFields).data_);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8," ,;|\t\n\r",&local_c9);
    StringTokenizer::StringTokenizer(&local_88,&local_c8,&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_c8);
    while( true ) {
      bVar1 = StringTokenizer::hasMoreTokens(&local_88);
      if (!bVar1) break;
      StringTokenizer::nextToken_abi_cxx11_(&local_c8,&local_88);
      std::locale::locale((locale *)&local_a8);
      toUpper<std::__cxx11::string>(&local_c8,(locale *)&local_a8);
      std::locale::~locale((locale *)&local_a8);
      bVar1 = std::operator==(&local_c8,"ELECTRICFIELD");
      if (bVar1) {
LAB_001cbc0b:
        this->calculateElectricField_ = true;
        std::__cxx11::string::~string((string *)&local_c8);
        break;
      }
      bVar1 = std::operator==(&local_c8,"ELECTROSTATICPOTENTIAL");
      if (bVar1) goto LAB_001cbc0b;
      std::__cxx11::string::~string((string *)&local_c8);
    }
    requiresElectricField()::wasParsed = '\x01';
    StringTokenizer::~StringTokenizer(&local_88);
  }
  return this->calculateElectricField_;
}

Assistant:

bool RNEMDParameters::requiresElectricField() {
    static bool wasParsed {false};

    if (!wasParsed) {
      StringTokenizer tokenizer(getOutputFields(), " ,;|\t\n\r");

      while (tokenizer.hasMoreTokens()) {
        std::string token(tokenizer.nextToken());
        toUpper(token);

        if (token == "ELECTRICFIELD" || token == "ELECTROSTATICPOTENTIAL") {
          calculateElectricField_ = true;
          break;
        }
      }

      wasParsed = true;
    }

    return calculateElectricField_;
  }